

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O3

bool __thiscall CCheckQueue<UniqueCheck>::Loop(CCheckQueue<UniqueCheck> *this,bool fMaster)

{
  CCheckQueue<UniqueCheck> *pCVar1;
  UniqueCheck *pUVar2;
  CCheckQueue<UniqueCheck> CVar3;
  uint uVar4;
  unique_lock *puVar5;
  long lVar6;
  undefined7 in_register_00000031;
  uint uVar7;
  ulong uVar8;
  UniqueCheck *check;
  UniqueCheck *this_00;
  long lVar9;
  long in_FS_OFFSET;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueCheck *local_68;
  UniqueCheck *pUStack_60;
  long local_58;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (unique_lock *)(this + 0x28);
  if ((int)CONCAT71(in_register_00000031,fMaster) != 0) {
    puVar5 = (unique_lock *)(this + 0x58);
  }
  local_68 = (UniqueCheck *)0x0;
  pUStack_60 = (UniqueCheck *)0x0;
  local_58 = 0;
  std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::reserve
            ((vector<UniqueCheck,_std::allocator<UniqueCheck>_> *)&local_68,
             (ulong)*(uint *)(this + 0xb0));
  uVar8 = 0;
  CVar3 = (CCheckQueue<UniqueCheck>)0x1;
  do {
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_48);
    if ((int)uVar8 == 0) {
      *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + 1;
    }
    else {
      this[0xa8] = (CCheckQueue<UniqueCheck>)((byte)this[0xa8] & (byte)CVar3);
      pCVar1 = this + 0xac;
      *(int *)pCVar1 = *(int *)pCVar1 - (int)uVar8;
      if (*(int *)pCVar1 == 0 && !fMaster) {
        std::condition_variable::notify_one();
      }
    }
    lVar9 = *(long *)(this + 0x88);
    lVar6 = *(long *)(this + 0x90);
    if (lVar9 == lVar6) {
      do {
        if (this[0xd0] != (CCheckQueue<UniqueCheck>)0x0) break;
        if ((fMaster) && (*(int *)(this + 0xac) == 0)) {
          *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + -1;
          CVar3 = this[0xa8];
          this[0xa8] = (CCheckQueue<UniqueCheck>)0x1;
          goto LAB_00313780;
        }
        *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + 1;
        std::condition_variable::wait(puVar5);
        *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + -1;
        lVar9 = *(long *)(this + 0x88);
        lVar6 = *(long *)(this + 0x90);
      } while (lVar9 == lVar6);
    }
    if (this[0xd0] != (CCheckQueue<UniqueCheck>)0x0) {
      CVar3 = (CCheckQueue<UniqueCheck>)0x0;
LAB_00313780:
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
      if (local_68 != (UniqueCheck *)0x0) {
        operator_delete(local_68,local_58 - (long)local_68);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (bool)CVar3;
    }
    uVar4 = (uint)(((ulong)(lVar6 - lVar9) >> 3 & 0xffffffff) /
                  (ulong)(*(int *)(this + 0xa4) + *(int *)(this + 0xa0) + 1));
    uVar7 = *(uint *)(this + 0xb0);
    if (uVar4 < *(uint *)(this + 0xb0)) {
      uVar7 = uVar4;
    }
    uVar8 = (ulong)(uVar7 + (uVar7 == 0));
    lVar9 = lVar6 + uVar8 * -8;
    std::vector<UniqueCheck,std::allocator<UniqueCheck>>::
    _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<UniqueCheck*,std::vector<UniqueCheck,std::allocator<UniqueCheck>>>>>
              ((vector<UniqueCheck,std::allocator<UniqueCheck>> *)&local_68,lVar9,lVar6);
    if (lVar9 != *(long *)(this + 0x90)) {
      *(long *)(this + 0x90) = lVar9;
    }
    CVar3 = this[0xa8];
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    pUVar2 = pUStack_60;
    this_00 = local_68;
    if (local_68 != pUStack_60) {
      do {
        if (((byte)CVar3 & 1) != 0) {
          CVar3 = (CCheckQueue<UniqueCheck>)UniqueCheck::operator()(this_00);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pUVar2);
      if (pUStack_60 != local_68) {
        pUStack_60 = local_68;
      }
    }
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }